

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  uint8_t *puVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  upb_MiniTableField *puVar5;
  char cVar6;
  uint16_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  upb_MtDecoder *puVar12;
  byte bVar13;
  upb_OneOfLayoutItem item;
  char *pcVar14;
  ulong uVar15;
  byte *pbVar16;
  upb_MtDecoder *puVar17;
  byte *pbVar18;
  uint uVar19;
  byte *pbVar20;
  int iVar21;
  uint uVar22;
  uint unaff_R14D;
  byte *pbVar23;
  byte *pbVar24;
  bool bVar25;
  bool bVar26;
  uint *local_78;
  byte *local_50;
  
  bVar26 = d->table != (upb_MiniTable *)0x0;
  (d->base).end = ptr + len;
  uVar4 = 0;
  uVar10 = 0;
  local_78 = (uint *)0x0;
  while( true ) {
    pbVar18 = (byte *)(d->base).end;
    if (pbVar18 <= ptr) {
      if (!bVar26) {
        return (char *)(byte *)ptr;
      }
      d->table->dense_below_dont_copy_me__upb_internal_use_only =
           (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
      return (char *)(byte *)ptr;
    }
    pbVar23 = (byte *)ptr + 1;
    bVar13 = *ptr;
    uVar15 = (ulong)(char)bVar13;
    uVar9 = (ulong)bVar13;
    if ((long)uVar15 < 0x4a) break;
    if ((byte)(bVar13 + 0xb4) < 0x10) {
      uVar11 = 0xe;
      for (uVar22 = 0x1f; 0xeU >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
      uVar19 = 0;
      uVar8 = 0;
      do {
        iVar21 = -1;
        if (0xa0 < (byte)((char)uVar15 + 0x81U)) {
          iVar21 = (int)""[((uint)uVar15 & 0xff) - 0x20];
        }
        uVar19 = uVar19 | iVar21 + -0x2a << ((byte)uVar8 & 0x1f);
        if ((pbVar23 == pbVar18) || (bVar13 = *pbVar23, (byte)(bVar13 + 0xa4) < 0xf0)) {
          bVar25 = false;
          ptr = (char *)pbVar23;
          uVar11 = uVar19;
        }
        else {
          pbVar23 = pbVar23 + 1;
          uVar8 = uVar8 + (uVar22 ^ 0xffffffe0) + 0x21;
          bVar25 = uVar8 < 0x20;
          if (!bVar25) {
            ptr = (char *)0x0;
          }
          uVar15 = (ulong)bVar13;
        }
      } while (bVar25);
      if ((byte *)ptr == (byte *)0x0) {
LAB_00503cb8:
        pcVar14 = "Overlong varint";
LAB_00503d51:
        upb_MdDecoder_ErrorJmp(&d->base,pcVar14);
      }
      if (local_78 == (uint *)0x0) {
        uVar4 = uVar11;
        if (d->table == (upb_MiniTable *)0x0) {
          pcVar14 = "Extensions cannot have message modifiers";
          goto LAB_00503d51;
        }
      }
      else {
        if ((uVar11 & 1) != 0) {
          if (((*(byte *)((long)local_78 + 0xb) & 1) == 0) ||
             ((0xffffe1ffU >> (*(byte *)((long)local_78 + 10) & 0x1f) & 1) == 0)) {
            uVar9 = (ulong)*local_78;
            pcVar14 = "Cannot flip packed on unpackable field %u";
            goto LAB_00503d64;
          }
          *(byte *)((long)local_78 + 0xb) = *(byte *)((long)local_78 + 0xb) ^ 4;
        }
        if ((uVar11 & 8) != 0) {
          if ((*(byte *)((long)local_78 + 10) != 0xc) ||
             ((*(byte *)((long)local_78 + 0xb) & 0x10) == 0)) {
            upb_MdDecoder_ErrorJmp
                      (&d->base,"Cannot flip ValidateUtf8 on field %u, type=%d, mode=%d",
                       (ulong)*local_78,(ulong)*(byte *)((long)local_78 + 10),
                       (ulong)*(byte *)((long)local_78 + 0xb));
          }
          *(undefined1 *)((long)local_78 + 10) = 9;
          *(byte *)((long)local_78 + 0xb) = *(byte *)((long)local_78 + 0xb) & 0xef;
        }
        if ((uVar11 & 6) != 0) {
          if ((short)local_78[1] != 1) {
            uVar9 = (ulong)*local_78;
            pcVar14 = "Invalid modifier(s) for repeated field %u";
            goto LAB_00503d64;
          }
          if ((uVar11 & 6) == 6) {
            uVar9 = (ulong)*local_78;
            pcVar14 = "Field %u cannot be both singular and required";
            goto LAB_00503d64;
          }
        }
        if ((uVar11 & 4) != 0) {
          if ((*(byte *)((long)local_78 + 10) & 0xfe) == 10) {
            uVar9 = (ulong)*local_78;
            pcVar14 = "Field %u cannot be a singular submessage";
            goto LAB_00503d64;
          }
          *(undefined2 *)(local_78 + 1) = 0;
        }
        if ((uVar11 & 2) != 0) {
          *(undefined2 *)(local_78 + 1) = 2;
        }
      }
      bVar25 = true;
      if ((uVar4 & 4) != 0) {
        puVar1 = &d->table->ext_dont_copy_me__upb_internal_use_only;
        *puVar1 = *puVar1 | 1;
      }
    }
    else if (bVar13 == 0x5e) {
      if (d->table == (upb_MiniTable *)0x0) {
        pcVar14 = "Extensions cannot have oneofs.";
        goto LAB_00503d51;
      }
      item.field_index = 0xffff;
      item.rep = '\0';
      item._3_1_ = 0;
      if (pbVar23 < pbVar18) {
        uVar11 = 0xffff;
        uVar22 = 0;
        do {
          bVar13 = *pbVar23;
          pbVar24 = pbVar23 + 1;
          pbVar23 = pbVar24;
          if (bVar13 != 0x7c) {
            if (bVar13 != 0x7e) {
              for (uVar8 = 0x1f; 0x3eU >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
              puVar17 = (upb_MtDecoder *)0x0;
              uVar19 = 0;
              puVar12 = d;
              do {
                iVar21 = -1;
                if (0xa0 < (byte)(bVar13 + 0x81)) {
                  iVar21 = (int)""[bVar13 - 0x20];
                }
                puVar17 = (upb_MtDecoder *)(ulong)((uint)puVar17 | iVar21 << ((byte)uVar19 & 0x1f));
                if ((pbVar24 == pbVar18) || (bVar3 = *pbVar24, (byte)(bVar3 + 0x9d) < 0xbd)) {
                  bVar25 = false;
                  puVar12 = puVar17;
                  pbVar23 = pbVar24;
                }
                else {
                  pbVar24 = pbVar24 + 1;
                  uVar19 = uVar19 + (uVar8 ^ 0xffffffe0) + 0x21;
                  bVar25 = uVar19 < 0x20;
                  bVar13 = bVar3;
                  if (!bVar25) {
                    pbVar23 = (byte *)0x0;
                  }
                }
              } while (bVar25);
              if (pbVar23 == (byte *)0x0) {
                pcVar14 = "Overlong varint";
                goto LAB_00503d51;
              }
              puVar5 = upb_MiniTable_FindFieldByNumber(d->table,(uint32_t)puVar12);
              if (puVar5 == (upb_MiniTableField *)0x0) {
                pcVar14 = "Couldn\'t add field number %u to oneof, no such field number.";
              }
              else {
                if (puVar5->offset_dont_copy_me__upb_internal_use_only == 1) {
                  uVar8 = (uint)(puVar5->mode_dont_copy_me__upb_internal_use_only >> 6);
                  pbVar18 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar22;
                  pbVar24 = &upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar22;
                  bVar25 = d->platform != kUpb_MiniTablePlatform_32Bit;
                  pbVar16 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar8;
                  if (!bVar25) {
                    pbVar16 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar8;
                  }
                  pbVar20 = &upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar8;
                  if (bVar25) {
                    pbVar20 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar8;
                  }
                  bVar13 = *pbVar20;
                  if (bVar25) {
                    pbVar24 = pbVar18;
                    pbVar18 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar22;
                  }
                  bVar3 = *pbVar24;
                  if ((*pbVar18 < *pbVar16) || ((*pbVar16 == *pbVar18 && (bVar3 < bVar13)))) {
                    uVar22 = uVar8;
                    if (bVar13 < bVar3) {
                      __assert_fail("new_align >= current_align",
                                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/decode.c"
                                    ,0x15f,
                                    "const char *upb_MtDecoder_DecodeOneofField(upb_MtDecoder *, const char *, char, upb_OneOfLayoutItem *)"
                                   );
                    }
                  }
                  else if (bVar3 < bVar13) {
                    __assert_fail("current_align >= new_align",
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/decode.c"
                                  ,0x162,
                                  "const char *upb_MtDecoder_DecodeOneofField(upb_MtDecoder *, const char *, char, upb_OneOfLayoutItem *)"
                                 );
                  }
                  puVar5->offset_dont_copy_me__upb_internal_use_only = (uint16_t)uVar11;
                  uVar11 = ((uint)((int)puVar5 - *(int *)&d->fields) >> 2) * -0x5555 + 3;
                  goto LAB_00503a21;
                }
                pcVar14 = "Cannot add repeated, required, or singular field %u to oneof.";
              }
              uVar9 = (ulong)puVar12 & 0xffffffff;
              goto LAB_00503d64;
            }
            upb_MtDecoder_PushOneof(d,(upb_OneOfLayoutItem)(uVar11 & 0xffff | uVar22 << 0x10));
            uVar11 = 0xffff;
          }
LAB_00503a21:
          pbVar18 = (byte *)(d->base).end;
        } while (pbVar23 < pbVar18);
        item = (upb_OneOfLayoutItem)(uVar11 & 0xffff | uVar22 << 0x10);
      }
      upb_MtDecoder_PushOneof(d,item);
      puVar2 = (uint *)fields;
      ptr = (char *)pbVar23;
LAB_00503c33:
      fields = puVar2;
      bVar25 = true;
    }
    else {
      if (0x1f < (byte)(bVar13 + 0xa1)) {
        pcVar14 = "Invalid char: %c";
        goto LAB_00503d64;
      }
      if (bVar26) {
        d->table->dense_below_dont_copy_me__upb_internal_use_only =
             (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
        bVar26 = false;
      }
      ptr = (char *)0x1e;
      for (uVar22 = 0x1f; 0x1eU >> uVar22 == 0; uVar22 = uVar22 - 1) {
      }
      uVar8 = 0;
      uVar11 = 0;
      do {
        iVar21 = -1;
        if (0xa0 < (byte)((char)uVar15 + 0x81U)) {
          iVar21 = (int)""[((uint)uVar15 & 0xff) - 0x20];
        }
        uVar8 = uVar8 | iVar21 + -0x3c << ((byte)uVar11 & 0x1f);
        if ((pbVar23 == (byte *)(d->base).end) ||
           (uVar9 = (ulong)*pbVar23, (byte)(*pbVar23 + 0x81) < 0xe0)) {
          bVar25 = false;
          ptr = (char *)pbVar23;
          uVar9 = uVar15;
          unaff_R14D = uVar8;
        }
        else {
          pbVar23 = pbVar23 + 1;
          uVar11 = uVar11 + (uVar22 ^ 0xffffffe0) + 0x21;
          bVar25 = uVar11 < 0x20;
          if (!bVar25) {
            ptr = (char *)0x0;
          }
        }
        uVar15 = uVar9;
      } while (bVar25);
      if ((byte *)ptr == (byte *)0x0) goto LAB_00503cb8;
      uVar10 = (uVar10 + unaff_R14D) - 1;
      bVar25 = true;
    }
LAB_00503c36:
    if (!bVar25) {
      return (char *)local_50;
    }
  }
  if ((d->table == (upb_MiniTable *)0x0) && (local_78 != (uint *)0x0)) {
    bVar25 = false;
    local_50 = (byte *)ptr;
    goto LAB_00503c36;
  }
  *field_count = *field_count + 1;
  uVar10 = uVar10 + 1;
  *(uint *)fields = uVar10;
  bVar3 = 0xff;
  if (0xa0 < (byte)(bVar13 + 0x81)) {
    bVar3 = ""[(int)(char)bVar13 - 0x20];
  }
  cVar6 = (d->platform != kUpb_MiniTablePlatform_32Bit) * '\x02' + '\x01';
  if (bVar13 < 0x36) {
    *(undefined1 *)((long)fields + 0xb) = 2;
    *(undefined2 *)((long)fields + 4) = 1;
    if ((bVar3 & 0xfe) == 0x10) {
LAB_00503854:
      *(byte *)((long)fields + 0xb) = cVar6 << 6 | 2;
      goto LAB_00503a6d;
    }
    if (bVar3 < 0x13) {
      cVar6 = upb_MiniTable_SetField_kUpb_EncodedToFieldRep[bVar3];
      goto LAB_00503854;
    }
  }
  else {
    bVar3 = bVar3 - 0x14;
    *(char *)((long)fields + 0xb) = cVar6 * '@' + '\x01';
    *(undefined2 *)((long)fields + 4) = 0;
LAB_00503a6d:
    if (bVar3 < 0x13) {
      bVar13 = 5;
      if (bVar3 == 0xc) {
LAB_00503a82:
        bVar3 = bVar13;
        *(byte *)((long)fields + 0xb) = *(byte *)((long)fields + 0xb) | 0x10;
      }
      else if (bVar3 == 0xf) {
        bVar3 = 9;
        bVar13 = 0xc;
        if ((uVar4 & 1) == 0) goto LAB_00503a82;
      }
      else {
        bVar3 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar3];
      }
      *(byte *)((long)fields + 10) = bVar3;
      if ((((uVar4 & 2) != 0) && ((*(byte *)((long)fields + 0xb) & 1) != 0)) &&
         ((1 << (bVar3 & 0x1f) & 0xffffe1ffU) != 0)) {
        *(byte *)((long)fields + 0xb) = *(byte *)((long)fields + 0xb) | 4;
      }
      puVar2 = (uint *)((long)fields + field_size);
      ptr = (char *)pbVar23;
      local_78 = (uint *)fields;
      if ((bVar3 & 0xfe) == 10) {
        uVar7 = sub_counts->submsg_count;
        sub_counts->submsg_count = uVar7 + 1;
      }
      else {
        if (bVar3 != 0xe) {
          *(undefined2 *)((long)fields + 8) = 0xffff;
          goto LAB_00503c33;
        }
        uVar7 = sub_counts->subenum_count;
        sub_counts->subenum_count = uVar7 + 1;
      }
      *(uint16_t *)((long)fields + 8) = uVar7;
      goto LAB_00503c33;
    }
  }
  uVar9 = (ulong)(uint)(int)(char)bVar3;
  pcVar14 = "Invalid field type: %d";
LAB_00503d64:
  upb_MdDecoder_ErrorJmp(&d->base,pcVar14,uVar9);
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}